

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RenameExprlistUnmap(Parse *pParse,ExprList *pEList)

{
  long lVar1;
  char **ppcVar2;
  Walker local_50;
  
  if (pEList != (ExprList *)0x0) {
    local_50.walkerDepth = 0;
    local_50.eCode = 0;
    local_50._38_2_ = 0;
    local_50.u.pNC = (NameContext *)0x0;
    local_50.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_50.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_50.xExprCallback = renameUnmapExprCb;
    local_50.pParse = pParse;
    sqlite3WalkExprList(&local_50,pEList);
    ppcVar2 = &pEList->a[0].zEName;
    for (lVar1 = 0; lVar1 < pEList->nExpr; lVar1 = lVar1 + 1) {
      if ((*(byte *)((long)ppcVar2 + 9) & 3) == 0) {
        sqlite3RenameTokenRemap(pParse,(void *)0x0,*ppcVar2);
      }
      ppcVar2 = ppcVar2 + 3;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameExprlistUnmap(Parse *pParse, ExprList *pEList){
  if( pEList ){
    int i;
    Walker sWalker;
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = pParse;
    sWalker.xExprCallback = renameUnmapExprCb;
    sqlite3WalkExprList(&sWalker, pEList);
    for(i=0; i<pEList->nExpr; i++){
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME) ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pEList->a[i].zEName);
      }
    }
  }
}